

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  ImGuiItemStatusFlags *pIVar1;
  ImRect *r_abs;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiID id;
  long lVar6;
  int button;
  int iVar7;
  uint uVar8;
  
  pIVar3 = GImGui;
  if ((flags & 0x10U) == 0) {
    pIVar2 = GImGui->CurrentWindow;
    id = (GImGui->LastItemData).ID;
    if (id == 0) {
      if ((((GImGui->IO).MouseDown[0] != false) && (pIVar2->SkipItems == false)) &&
         ((((GImGui->LastItemData).StatusFlags & 1) != 0 ||
          ((GImGui->ActiveId != 0 && (GImGui->ActiveIdWindow == pIVar2)))))) {
        if ((flags & 8U) == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x2b6d,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
        }
        r_abs = &(GImGui->LastItemData).Rect;
        id = ImGuiWindow::GetIDFromRectangle(pIVar2,r_abs);
        (pIVar3->LastItemData).ID = id;
        pIVar4 = GImGui;
        if (GImGui->ActiveId == id) {
          GImGui->ActiveIdIsAlive = id;
        }
        if (pIVar4->ActiveIdPreviousFrame == id) {
          pIVar4->ActiveIdPreviousFrameIsAlive = true;
        }
        bVar5 = ItemHoverable(r_abs,id);
        if ((bVar5) && ((pIVar3->IO).MouseClicked[0] == true)) {
          SetActiveID(id,pIVar2);
          FocusWindow(pIVar2);
        }
        button = 0;
        if (pIVar3->ActiveId == id) goto LAB_00142ce6;
        goto LAB_00142ced;
      }
    }
    else {
      iVar7 = 0;
      if (GImGui->ActiveId != id) goto LAB_00142d2e;
      button = GImGui->ActiveIdMouseButton;
      if (GImGui->ActiveIdMouseButton == -1) {
        button = iVar7;
      }
      if ((GImGui->IO).MouseDown[button] == false) goto LAB_00142d2e;
      iVar7 = 0;
      bVar5 = false;
      if (pIVar2->SkipItems != false) goto LAB_00142d2e;
LAB_00142ce6:
      pIVar3->ActiveIdAllowOverlap = bVar5;
LAB_00142ced:
      if (pIVar3->ActiveId == id) {
        lVar6 = (long)(pIVar2->IDStack).Size;
        if (lVar6 < 1) {
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                        ,0x70c,"T &ImVector<unsigned int>::back() [T = unsigned int]");
        }
        uVar8 = (pIVar2->IDStack).Data[lVar6 + -1];
        bVar5 = IsMouseDragging(button,-1.0);
        SetActiveIdUsingNavAndKeys();
        goto LAB_00142b63;
      }
    }
  }
  else {
    uVar8 = 0;
    id = ImHashStr("#SourceExtern",0,0);
    bVar5 = true;
    button = 0;
LAB_00142b63:
    if (bVar5 != false) {
      if (pIVar3->DragDropActive == false) {
        if (id == 0) {
          __assert_fail("source_id != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x2b94,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
        }
        ClearDragDrop();
        (pIVar3->DragDropPayload).SourceId = id;
        (pIVar3->DragDropPayload).SourceParentId = uVar8;
        pIVar3->DragDropActive = true;
        pIVar3->DragDropSourceFlags = flags;
        pIVar3->DragDropMouseButton = button;
        if (id == pIVar3->ActiveId) {
          pIVar3->ActiveIdNoClearOnFocusLoss = true;
        }
      }
      pIVar3->DragDropSourceFrameCount = pIVar3->FrameCount;
      pIVar3->DragDropWithinSource = true;
      if ((((flags & 1U) == 0) && (BeginTooltipEx(0,0), pIVar3->DragDropAcceptIdPrev != 0)) &&
         ((pIVar3->DragDropAcceptFlags & 0x1000) != 0)) {
        pIVar2 = pIVar3->CurrentWindow;
        pIVar2->SkipItems = true;
        pIVar2->Hidden = true;
        pIVar2->HiddenFramesCanSkipItems = '\x01';
      }
      iVar7 = 1;
      if ((flags & 0x12U) == 0) {
        pIVar1 = &(pIVar3->LastItemData).StatusFlags;
        *(byte *)pIVar1 = (byte)*pIVar1 & 0xfe;
      }
      goto LAB_00142d2e;
    }
  }
  iVar7 = 0;
LAB_00142d2e:
  return SUB41(iVar7,0);
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // FIXME-DRAGDROP: While in the common-most "drag from non-zero active id" case we can tell the mouse button,
    // in both SourceExtern and id==0 cases we may requires something else (explicit flags or some heuristic).
    ImGuiMouseButton mouse_button = ImGuiMouseButton_Left;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    if (!(flags & ImGuiDragDropFlags_SourceExtern))
    {
        source_id = g.LastItemData.ID;
        if (source_id != 0)
        {
            // Common path: items with ID
            if (g.ActiveId != source_id)
                return false;
            if (g.ActiveIdMouseButton != -1)
                mouse_button = g.ActiveIdMouseButton;
            if (g.IO.MouseDown[mouse_button] == false || window->SkipItems)
                return false;
            g.ActiveIdAllowOverlap = false;
        }
        else
        {
            // Uncommon path: items without ID
            if (g.IO.MouseDown[mouse_button] == false || window->SkipItems)
                return false;
            if ((g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect) == 0 && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;

            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Magic fallback to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING/RESIZINGG OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            // Rely on keeping other window->LastItemXXX fields intact.
            source_id = g.LastItemData.ID = window->GetIDFromRectangle(g.LastItemData.Rect);
            KeepAliveID(source_id);
            bool is_hovered = ItemHoverable(g.LastItemData.Rect, source_id);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);

        // Disable navigation and key inputs while dragging + cancel existing request if any
        SetActiveIdUsingNavAndKeys();
    }
    else
    {
        window = NULL;
        source_id = ImHashStr("#SourceExtern");
        source_drag_active = true;
    }

    if (source_drag_active)
    {
        if (!g.DragDropActive)
        {
            IM_ASSERT(source_id != 0);
            ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = source_parent_id;
            g.DragDropActive = true;
            g.DragDropSourceFlags = flags;
            g.DragDropMouseButton = mouse_button;
            if (payload.SourceId == g.ActiveId)
                g.ActiveIdNoClearOnFocusLoss = true;
        }
        g.DragDropSourceFrameCount = g.FrameCount;
        g.DragDropWithinSource = true;

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        {
            // Target can request the Source to not display its tooltip (we use a dedicated flag to make this request explicit)
            // We unfortunately can't just modify the source flags and skip the call to BeginTooltip, as caller may be emitting contents.
            BeginTooltip();
            if (g.DragDropAcceptIdPrev && (g.DragDropAcceptFlags & ImGuiDragDropFlags_AcceptNoPreviewTooltip))
            {
                ImGuiWindow* tooltip_window = g.CurrentWindow;
                tooltip_window->Hidden = tooltip_window->SkipItems = true;
                tooltip_window->HiddenFramesCanSkipItems = 1;
            }
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
            g.LastItemData.StatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

        return true;
    }
    return false;
}